

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double gammacdf(double x,double k,double th)

{
  double dVar1;
  
  if ((0.0 < k) && (0.0 < th)) {
    dVar1 = pgamma((double)(~-(ulong)(x <= 0.0) & (ulong)x) / th,k);
    return dVar1;
  }
  printf("Gamma Distribution parameters must be positive and real.");
  exit(1);
}

Assistant:

double gammacdf(double x, double k, double th) {
	double oup,t;
	
	if (k <= 0. || th <= 0.) {
		printf("Gamma Distribution parameters must be positive and real.");
		exit(1);
	}
	
	if (x <= 0.) {
		x = 0.;
	}
	
	t = x/th;
	
	oup = pgamma(t,k);
	
	return oup;
}